

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O0

void __thiscall
ctemplate::IndentedWriter::Write
          (IndentedWriter *this,string *s1,string *s2,string *s3,string *s4,string *s5,string *s6,
          string *s7)

{
  ulong uVar1;
  string *s5_local;
  string *s4_local;
  string *s3_local;
  string *s2_local;
  string *s1_local;
  IndentedWriter *this_local;
  
  DoWrite(this,s1);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    DoWrite(this,s2);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    DoWrite(this,s3);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    DoWrite(this,s4);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    DoWrite(this,s5);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    DoWrite(this,s6);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    DoWrite(this,s7);
  }
  return;
}

Assistant:

void Write(string s1,
             string s2 = string(),
             string s3 = string(),
             string s4 = string(),
             string s5 = string(),
             string s6 = string(),
             string s7 = string()) {
    DoWrite(s1);
    if (!s2.empty()) DoWrite(s2);
    if (!s3.empty()) DoWrite(s3);
    if (!s4.empty()) DoWrite(s4);
    if (!s5.empty()) DoWrite(s5);
    if (!s6.empty()) DoWrite(s6);
    if (!s7.empty()) DoWrite(s7);
  }